

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_3_4::ThreadPool::addTask(ThreadPool *this,Task *task)

{
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> sVar1;
  ProviderPtr p;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> local_20;
  
  if (task != (Task *)0x0) {
    sVar1 = std::atomic_load<IlmThread_3_4::ThreadPoolProvider>(&local_20);
    if (local_20.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      anon_unknown_5::handleProcessTask(task);
    }
    else {
      (*(local_20.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ThreadPoolProvider[4])
                (local_20.
                 super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,task,
                 sVar1.
                 super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.
                super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void
ThreadPool::addTask (Task* task)
{
    if (task)
    {
#ifdef ENABLE_THREADING
        Data::ProviderPtr p = _data->getProvider ();
        if (p)
        {
            p->addTask (task);
            return;
        }
#endif

        handleProcessTask (task);
    }
}